

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O1

void __thiscall
Js::StepController::AddToReturnedValueContainer
          (StepController *this,Var returnValue,JavascriptFunction *function,
          bool isValueOfReturnStatement)

{
  Recycler *alloc;
  ReturnedValue *this_00;
  undefined **local_60;
  ReturnedValue *valuePair;
  size_t local_50;
  char *local_48;
  DWORD local_40;
  JavascriptFunction *local_38;
  
  if (this->pActivatedContext != (ScriptContext *)0x0) {
    local_60 = &ReturnedValue::typeinfo;
    valuePair = (ReturnedValue *)0x0;
    local_50 = 0xffffffffffffffff;
    local_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagProbe.cpp"
    ;
    local_40 = 0x7a;
    local_38 = function;
    alloc = Memory::Recycler::TrackAllocInfo
                      (this->pActivatedContext->recycler,(TrackAllocData *)&stack0xffffffffffffffa0)
    ;
    this_00 = (ReturnedValue *)new<Memory::Recycler>(0x18,alloc,0x38bbb2);
    ReturnedValue::ReturnedValue(this_00,returnValue,local_38,isValueOfReturnStatement);
    local_60 = (undefined **)this_00;
    JsUtil::
    List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
              (this->returnedValueList,(ReturnedValue **)&stack0xffffffffffffffa0);
  }
  return;
}

Assistant:

void StepController::AddToReturnedValueContainer(Js::Var returnValue, Js::JavascriptFunction * function, bool isValueOfReturnStatement)
    {
        if (this->pActivatedContext != nullptr) // This will be null when we execute scripts when on break.
        {
            ReturnedValue *valuePair = RecyclerNew(pActivatedContext->GetRecycler(), ReturnedValue, returnValue, function, isValueOfReturnStatement);
            this->returnedValueList->Add(valuePair);
        }
    }